

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorBetweenUnitsSameNameLostChildren_Test::TestBody
          (Units_scalingFactorBetweenUnitsSameNameLostChildren_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_108 [8];
  Message local_100 [8];
  double local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  double scaling;
  UnitsPtr u2;
  ModelPtr model2;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u1;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model1;
  Units_scalingFactorBetweenUnitsSameNameLostChildren_Test *this_local;
  
  model1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model1",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"units",&local_89);
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"oranges",
             (allocator<char> *)
             ((long)&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Model::clone();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Model::units((ulong)&scaling);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       libcellml::Units::scalingFactor((shared_ptr *)local_68,(shared_ptr *)&scaling,true);
  local_f8 = 0.0;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_f0,"0.0","scaling",&local_f8,(double *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa54,pcVar4);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&scaling);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsSameNameLostChildren)
{
    auto model1 = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("oranges");
    model1->addUnits(u1);

    auto model2 = model1->clone();
    auto u2 = model2->units(0);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(0.0, scaling);
}